

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

void build_colors(chunk *c,int *colors,int *counts,_Bool *stairs,_Bool diagonal)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  loc_conflict lVar5;
  queue *pqVar6;
  int *data;
  uintptr_t uVar7;
  long lVar8;
  ulong uVar9;
  int x;
  size_t sVar10;
  undefined3 in_register_00000081;
  int y;
  ulong uVar11;
  int local_84;
  loc local_78;
  wchar_t local_6c;
  uint local_68;
  int local_64;
  int *local_60;
  _Bool *local_58;
  long local_50;
  queue *local_48;
  ulong local_40;
  long local_38;
  
  local_6c = c->height;
  uVar11 = 0;
  uVar9 = (ulong)(uint)c->width;
  if (c->width < L'\x01') {
    uVar9 = uVar11;
  }
  if (local_6c < L'\x01') {
    local_6c = L'\0';
  }
  local_38 = (ulong)CONCAT31(in_register_00000081,diagonal) * 4 + 4;
  local_84 = 1;
  local_68 = (uint)uVar9;
  local_60 = counts;
  local_58 = stairs;
  while ((wchar_t)uVar11 != local_6c) {
    local_40 = uVar11;
    for (x = 0; y = (int)uVar11, x != (int)uVar9; x = x + 1) {
      lVar5 = loc(x,y);
      wVar2 = ignore_point(c,colors,lVar5);
      if (wVar2 == L'\0') {
        local_64 = x;
        lVar5 = loc(x,y);
        wVar2 = c->width;
        sVar10 = (long)c->height * (long)wVar2;
        pqVar6 = q_new(sVar10);
        data = (int *)mem_zalloc(sVar10 * 4);
        array_filler(data,L'\0',(wchar_t)sVar10);
        wVar3 = grid_to_i(lVar5,wVar2);
        q_push(pqVar6,(long)wVar3);
        local_50 = (long)local_84;
        local_60[local_50] = 0;
        local_48 = pqVar6;
        while (pqVar6 = local_48, sVar10 = q_len(local_48), sVar10 != 0) {
          uVar7 = q_pop(pqVar6);
          i_to_grid((wchar_t)uVar7,wVar2,(loc_conflict *)&local_78);
          wVar3 = ignore_point(c,colors,(loc_conflict)local_78);
          if (wVar3 == L'\0') {
            colors[(wchar_t)uVar7] = (int)local_50;
            local_60[local_50] = local_60[local_50] + 1;
            if ((local_58 != (_Bool *)0x0) &&
               (_Var1 = square_isstairs((chunk_conflict *)c,local_78), _Var1)) {
              local_58[local_50] = true;
            }
            for (lVar8 = 0; local_38 != lVar8; lVar8 = lVar8 + 1) {
              lVar5 = loc_sum((loc_conflict)local_78,(loc_conflict)ddgrid_ddd[lVar8]);
              wVar3 = grid_to_i(lVar5,wVar2);
              wVar4 = ignore_point(c,colors,lVar5);
              if ((wVar4 == L'\0') && (uVar7 = (uintptr_t)wVar3, data[uVar7] == 0)) {
                q_push(local_48,uVar7);
                data[uVar7] = 1;
              }
            }
          }
        }
        mem_free(data);
        q_free(pqVar6);
        local_84 = local_84 + 1;
        uVar9 = (ulong)local_68;
        uVar11 = local_40;
        x = local_64;
      }
    }
    uVar11 = (ulong)(y + 1);
  }
  return;
}

Assistant:

static void build_colors(struct chunk *c, int colors[], int counts[],
		bool *stairs, bool diagonal)
{
	int y, x;
	int h = c->height;
	int w = c->width;
	int color = 1;

	for (y = 0; y < h; y++) {
		for (x = 0; x < w; x++) {
			if (ignore_point(c, colors, loc(x, y))) continue;
			build_color_point(c, colors, counts, stairs,
				loc(x, y), color, diagonal);
			color++;
		}
	}
}